

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.cpp
# Opt level: O2

void line_x_validate(Am_Web_Events *events)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Am_Slot_Key AVar4;
  int value;
  int value_00;
  int iVar5;
  int iVar6;
  Am_Value *pAVar7;
  ostream *poVar8;
  char *pcVar9;
  Am_Object self;
  Am_Style ls;
  Am_Slot slot;
  int wh_adjustment;
  int rb_adjustment;
  int lt_adjustment;
  
  Am_Web_Events::Start(events);
  slot = Am_Web_Events::Get(events);
  Am_Slot::Get_Owner((Am_Slot *)&ls);
  Am_Object::Am_Object(&self,(Am_Object *)&ls);
  Am_Object::~Am_Object((Am_Object *)&ls);
  pAVar7 = Am_Object::Get(&self,0x8b,0);
  value = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(&self,0x8d,0);
  value_00 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(&self,100,0);
  iVar5 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(&self,0x66,0);
  iVar6 = Am_Value::operator_cast_to_int(pAVar7);
  pAVar7 = Am_Object::Get(&self,0x6b,0);
  Am_Style::Am_Style(&ls,pAVar7);
  get_thickness_adjustments(&ls,&lt_adjustment,&rb_adjustment,&wh_adjustment);
  bVar2 = false;
  bVar3 = false;
  do {
    bVar1 = Am_Web_Events::Last(events);
    if (bVar1) {
      if (bVar3) {
        Am_Object::Set(&self,0x8b,value,0);
        Am_Object::Set(&self,0x8d,value_00,0);
      }
      if (bVar2) {
        Am_Object::Set(&self,100,iVar5,0);
        Am_Object::Set(&self,0x66,iVar6,0);
      }
      Am_Style::~Am_Style(&ls);
      Am_Object::~Am_Object(&self);
      return;
    }
    slot = Am_Web_Events::Get(events);
    AVar4 = Am_Slot::Get_Key(&slot);
    if (AVar4 == 100) {
LAB_001ecbc3:
      if (value < value_00) {
        value = iVar5 + lt_adjustment;
        value_00 = (iVar6 + iVar5) - rb_adjustment;
      }
      else {
        value = (iVar6 + iVar5) - rb_adjustment;
        value_00 = iVar5 + lt_adjustment;
      }
      bVar3 = true;
    }
    else {
      if (AVar4 == 0x66) goto LAB_001ecbc3;
      if (AVar4 != 0x6b) {
        if ((AVar4 != 0x8b) && (AVar4 != 0x8d)) {
          poVar8 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
          poVar8 = std::operator<<(poVar8,"** Bug: unexpected slot in line_x_validate: ");
          AVar4 = Am_Slot::Get_Key(&slot);
          pcVar9 = Am_Get_Slot_Name(AVar4);
          poVar8 = std::operator<<(poVar8,pcVar9);
          std::endl<char,std::char_traits<char>>(poVar8);
          Am_Error();
        }
        iVar6 = value - value_00;
        iVar5 = value_00;
        if (value < value_00) {
          iVar5 = value;
        }
        iVar5 = iVar5 - lt_adjustment;
        if (iVar6 < 0) {
          iVar6 = -iVar6;
        }
        iVar6 = iVar6 + wh_adjustment;
        bVar2 = true;
      }
    }
    Am_Web_Events::Next(events);
  } while( true );
}

Assistant:

void
line_x_validate(Am_Web_Events &events)
{
  bool x1x2_changed = false;
  bool leftwidth_changed = false;

  events.Start();
  Am_Slot slot = events.Get();
  Am_Object self = slot.Get_Owner();
  int x1 = self.Get(Am_X1);
  int x2 = self.Get(Am_X2);
  int left = self.Get(Am_LEFT);
  int width = self.Get(Am_WIDTH);
  Am_Style ls = self.Get(Am_LINE_STYLE);
  int lt_adjustment, rb_adjustment, wh_adjustment;
  get_thickness_adjustments(ls, lt_adjustment, rb_adjustment, wh_adjustment);
  while (!events.Last()) {
    slot = events.Get();
    //std::cout << "__Line_x_Web " << self << " slot " << slot.Get_Key ()
    //  << " l,w,x1,x2 " << left << " " << width << " " << x1 << " " << x2
    //	 <<std::endl <<std::flush;
    switch (slot.Get_Key()) {
    case Am_X1:
    case Am_X2:
      left = imin(x1, x2) - lt_adjustment;
      width = iabs(x2 - x1) + wh_adjustment;
      leftwidth_changed = true;
      //std::cout << "__  left " << left << " width " << width <<std::endl <<std::flush;
      break;
    case Am_LEFT:
    case Am_WIDTH:
      if (x1 < x2) {
        x1 = left + lt_adjustment;
        x2 = left + width - rb_adjustment;
      } else {
        x1 = left + width - rb_adjustment;
        x2 = left + lt_adjustment;
      }
      x1x2_changed = true;
      //std::cout << "__  x1 " << x1 << " x2 " << x2 <<std::endl <<std::flush;
      break;
    case Am_LINE_STYLE:
      break;
    default:
      Am_ERROR("** Bug: unexpected slot in line_x_validate: "
               << Am_Get_Slot_Name(slot.Get_Key()));
    }
    events.Next();
  }

  if (x1x2_changed) {
    self.Set(Am_X1, x1);
    self.Set(Am_X2, x2);
  }

  if (leftwidth_changed) {
    self.Set(Am_LEFT, left);
    self.Set(Am_WIDTH, width);
  }
}